

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_hkdf_expand_label
              (ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t secret,
              char *label,ptls_iovec_t hash_value,char *base_label)

{
  ptls_iovec_t info;
  size_t sVar1;
  ptls_hash_algorithm_t *algo_00;
  size_t outlen_00;
  int iVar2;
  size_t sVar3;
  uint8_t *puVar4;
  size_t sVar5;
  size_t sVar6;
  char *__s;
  ptls_iovec_t prk;
  uint8_t hkdf_label_buf [512];
  ptls_buffer_t local_298;
  ptls_hash_algorithm_t *local_278;
  size_t local_270;
  size_t local_268;
  void *local_260;
  uint8_t *local_258;
  size_t local_250;
  uint8_t *local_248;
  size_t sStack_240;
  uint8_t local_238 [520];
  
  local_298.base = local_238;
  local_298.off = 0;
  local_298.capacity = 0x200;
  local_298.is_allocated = 0;
  local_250 = outlen;
  iVar2 = ptls_buffer_reserve(&local_298,2);
  outlen_00 = local_250;
  puVar4 = local_298.base;
  sVar5 = local_298.off;
  if (iVar2 == 0) {
    *(ushort *)(local_298.base + local_298.off) = (ushort)local_250 << 8 | (ushort)local_250 >> 8;
    local_298.off = local_298.off + 2;
    local_260 = output;
    local_258 = secret.base;
    iVar2 = ptls_buffer_reserve(&local_298,1);
    puVar4 = local_298.base;
    sVar5 = local_298.off;
    if (iVar2 == 0) {
      local_298.base[local_298.off] = '\0';
      sVar5 = local_298.off + 1;
      __s = "tls13 ";
      if (base_label != (char *)0x0) {
        __s = base_label;
      }
      local_298.off = sVar5;
      local_270 = secret.len;
      sVar3 = strlen(__s);
      local_268 = sVar5;
      if (sVar3 != 0) {
        iVar2 = ptls_buffer_reserve(&local_298,sVar3);
        sVar5 = local_298.off;
        puVar4 = local_298.base;
        if (iVar2 != 0) goto LAB_0019e4f6;
        memcpy(local_298.base + local_298.off,__s,sVar3);
        sVar5 = sVar3 + sVar5;
        local_298.off = sVar5;
      }
      local_278 = algo;
      sVar3 = strlen(label);
      if (sVar3 != 0) {
        iVar2 = ptls_buffer_reserve(&local_298,sVar3);
        sVar5 = local_298.off;
        puVar4 = local_298.base;
        if (iVar2 != 0) goto LAB_0019e4f6;
        memcpy(local_298.base + local_298.off,label,sVar3);
        sVar5 = sVar3 + sVar5;
        local_298.off = sVar5;
      }
      puVar4[local_268 - 1] = (char)sVar5 - (char)local_268;
      iVar2 = ptls_buffer_reserve(&local_298,1);
      algo_00 = local_278;
      sVar1 = local_298.off;
      puVar4 = local_298.base;
      sVar5 = local_298.off;
      if (iVar2 == 0) {
        local_298.base[local_298.off] = '\0';
        sVar6 = local_298.off + 1;
        sVar5 = sVar6;
        if (hash_value.len != 0) {
          local_298.off = sVar6;
          iVar2 = ptls_buffer_reserve(&local_298,hash_value.len);
          sVar5 = local_298.off;
          puVar4 = local_298.base;
          if (iVar2 != 0) goto LAB_0019e4f6;
          memcpy(local_298.base + local_298.off,hash_value.base,hash_value.len);
          sVar5 = sVar5 + hash_value.len;
        }
        puVar4[sVar1] = (char)sVar5 - (char)sVar6;
        info.len = sVar5;
        info.base = puVar4;
        prk.len = local_270;
        prk.base = local_258;
        local_298.off = sVar5;
        local_248 = puVar4;
        sStack_240 = sVar5;
        iVar2 = ptls_hkdf_expand(algo_00,local_260,outlen_00,prk,info);
      }
    }
  }
LAB_0019e4f6:
  (*ptls_clear_memory)(puVar4,sVar5);
  if (local_298.is_allocated != 0) {
    free(puVar4);
  }
  return iVar2;
}

Assistant:

int ptls_hkdf_expand_label(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t secret, const char *label,
                           ptls_iovec_t hash_value, const char *base_label)
{
    ptls_buffer_t hkdf_label;
    uint8_t hkdf_label_buf[512];
    int ret;

    ptls_buffer_init(&hkdf_label, hkdf_label_buf, sizeof(hkdf_label_buf));

    ptls_buffer_push16(&hkdf_label, (uint16_t)outlen);
    ptls_buffer_push_block(&hkdf_label, 1, {
        if (base_label == NULL)
            base_label = "tls13 ";
        ptls_buffer_pushv(&hkdf_label, base_label, strlen(base_label));
        ptls_buffer_pushv(&hkdf_label, label, strlen(label));
    });
    ptls_buffer_push_block(&hkdf_label, 1, { ptls_buffer_pushv(&hkdf_label, hash_value.base, hash_value.len); });

    ret = ptls_hkdf_expand(algo, output, outlen, secret, ptls_iovec_init(hkdf_label.base, hkdf_label.off));

Exit:
    ptls_buffer_dispose(&hkdf_label);
    return ret;
}